

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitCallRef
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,CallRef *curr,
          optional<wasm::HeapType> ht)

{
  ulong uVar1;
  bool bVar2;
  HeapType *pHVar3;
  size_t sVar4;
  size_t sVar5;
  Expression **ppEVar6;
  Type *pTVar7;
  Type local_70;
  uintptr_t local_68;
  ulong local_60;
  size_t i;
  Type local_48;
  Type params;
  Signature local_38;
  CallRef *local_28;
  CallRef *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<wasm::HeapType> ht_local;
  
  this_local = ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
  ht_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  local_28 = curr;
  curr_local = (CallRef *)this;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (!bVar2) {
    params.id = (uintptr_t)wasm::Type::getHeapType(&local_28->target->type);
    local_38 = HeapType::getSignature((HeapType *)&params);
    std::optional<wasm::HeapType>::operator=((optional<wasm::HeapType> *)&this_local,&local_38);
  }
  pHVar3 = std::optional<wasm::HeapType>::operator->((optional<wasm::HeapType> *)&this_local);
  _i = HeapType::getSignature(pHVar3);
  local_48.id = i;
  sVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(local_28->operands).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  sVar5 = wasm::Type::size(&local_48);
  if (sVar4 == sVar5) {
    local_60 = 0;
    while( true ) {
      uVar1 = local_60;
      sVar4 = wasm::Type::size(&local_48);
      if (sVar4 <= uVar1) break;
      ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(local_28->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,local_60);
      pTVar7 = wasm::Type::operator[](&local_48,local_60);
      local_68 = pTVar7->id;
      note(this,ppEVar6,(Type)local_68);
      local_60 = local_60 + 1;
    }
    ppEVar6 = &local_28->target;
    pHVar3 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&this_local);
    wasm::Type::Type(&local_70,(HeapType)pHVar3->id,Nullable,Inexact);
    note(this,ppEVar6,local_70);
    return;
  }
  __assert_fail("curr->operands.size() == params.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0x34b,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitCallRef(CallRef *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitCallRef(CallRef* curr, std::optional<HeapType> ht = std::nullopt) {
    if (!ht) {
      ht = curr->target->type.getHeapType().getSignature();
    }
    auto params = ht->getSignature().params;
    assert(curr->operands.size() == params.size());
    for (size_t i = 0; i < params.size(); ++i) {
      note(&curr->operands[i], params[i]);
    }
    note(&curr->target, Type(*ht, Nullable));
  }